

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O2

void detectDrawEyes(Mat *img,Mat *img_gray)

{
  undefined4 uVar1;
  undefined4 uVar4;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar5;
  size_t j;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  __m128d t;
  undefined8 *puVar10;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> eyes;
  undefined1 local_178 [8];
  undefined1 local_170 [16];
  undefined8 local_160;
  Mat *local_158;
  ulong local_150;
  undefined8 local_148;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  undefined8 local_128;
  undefined8 local_120;
  CascadeClassifier eyes_cascade;
  undefined4 local_108 [2];
  Mat *local_100;
  undefined8 local_f8;
  Mat faceROI;
  Mat local_90 [96];
  
  local_158 = img_gray;
  cv::Mat::Mat(local_90,img_gray);
  detectFaces(&faces,local_90);
  cv::Mat::~Mat(local_90);
  uVar7 = 0;
  while( true ) {
    if ((ulong)((long)faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7) break;
    cv::Mat::Mat(&faceROI,local_158,
                 (Rect_ *)(faces.
                           super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar7));
    cv::CascadeClassifier::CascadeClassifier(&eyes_cascade);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_178,"/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml",
               (allocator<char> *)&eyes);
    cv::CascadeClassifier::load((string *)&eyes_cascade);
    local_150 = uVar7;
    std::__cxx11::string::~string((string *)local_178);
    eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178._0_4_ = 0x1010000;
    local_170._8_8_ = 0;
    local_170._0_8_ = &faceROI;
    local_120 = 0x1e0000001e;
    local_128 = 0;
    puVar10 = &local_128;
    cv::CascadeClassifier::detectMultiScale
              (0x3ff199999999999a,&eyes_cascade,(string *)local_178,&eyes,2,2,&local_120,puVar10);
    lVar8 = 8;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)eyes.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)eyes.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1) {
      uVar1 = faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7].x;
      uVar4 = faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7].y;
      uVar2 = *(undefined8 *)
               ((long)eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
      uVar3 = *(undefined8 *)
               ((long)&(eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar8);
      iVar9 = (int)uVar3;
      iVar5 = (int)((ulong)uVar3 >> 0x20);
      local_f8 = 0;
      local_148 = CONCAT44(iVar5 / 2 + (int)((ulong)uVar2 >> 0x20) + uVar4,
                           iVar9 / 2 + (int)uVar2 + uVar1);
      local_108[0] = 0x3010000;
      local_100 = img;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_178);
      local_178 = (undefined1  [8])0x406fe00000000000;
      local_170 = (undefined1  [16])0x0;
      local_160 = 0;
      puVar10 = (undefined8 *)((ulong)puVar10 & 0xffffffff00000000);
      cv::circle(local_108,&local_148,(int)ROUND((double)(iVar5 + iVar9) * 0.25),(string *)local_178
                 ,1,8,puVar10);
      lVar8 = lVar8 + 0x10;
    }
    std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
              (&eyes.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
    cv::CascadeClassifier::~CascadeClassifier(&eyes_cascade);
    cv::Mat::~Mat(&faceROI);
    uVar7 = local_150 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&faceROI,"detect and draw eyes",(allocator<char> *)local_178);
  cv::namedWindow((string *)&faceROI,1);
  std::__cxx11::string::~string((string *)&faceROI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&faceROI,"detect and draw eyes",(allocator<char> *)&eyes);
  local_178._0_4_ = 0x1010000;
  local_170._8_8_ = 0;
  local_170._0_8_ = img;
  cv::imshow((string *)&faceROI,(_InputArray *)local_178);
  std::__cxx11::string::~string((string *)&faceROI);
  std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
            (&faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>);
  return;
}

Assistant:

void detectDrawEyes(Mat img, Mat img_gray) {
  vector<Rect> faces = detectFaces(img_gray);
  for (size_t i = 0; i < faces.size(); i++) {
    Mat faceROI = img_gray(faces[i]);
    CascadeClassifier eyes_cascade;
    eyes_cascade.load(
        "/usr/local/share/opencv4/haarcascades/haarcascade_eye.xml");
    vector<Rect> eyes;
    eyes_cascade.detectMultiScale(faceROI, eyes, 1.1, 2,
                                  0 | CASCADE_SCALE_IMAGE, Size(30, 30));
    for (size_t j = 0; j < eyes.size(); j++) {
      Point eyes_center(faces[i].x + eyes[j].x + eyes[j].width / 2,
                        faces[i].y + eyes[j].y + eyes[j].height / 2);
      int r = cvRound((eyes[j].width + eyes[j].height) * 0.25);
      circle(img, eyes_center, r, Scalar(255, 0, 0), 1, 8, 0);
    }
  }
  namedWindow("detect and draw eyes");
  imshow("detect and draw eyes", img);
}